

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

xml_output * attrTagX(xml_output *__return_storage_ptr__,char *name,QStringList *v,char *s)

{
  char *pcVar1;
  long lVar2;
  Data *pDVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  storage_type *psVar7;
  char16_t *pcVar8;
  storage_type *psVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  char *local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (v->d).size;
  local_60 = name;
  if (lVar2 == 0) {
    __return_storage_ptr__->xo_type = tNothing;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001f73ad;
    (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->xo_value).d.size = 0;
    (__return_storage_ptr__->xo_text).d.size = 0;
    (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.ptr = (char16_t *)0x0;
  }
  else {
    local_78.d = (v->d).d;
    local_78.ptr = (v->d).ptr;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar10.m_data = (storage_type *)0x5;
    QVar10.m_size = (qsizetype)&local_58;
    local_78.size = lVar2;
    QString::fromUtf8(QVar10);
    local_98.d.d = local_58.d.d;
    local_98.d.ptr = local_58.d.ptr;
    local_98.d.size = local_58.d.size;
    QString::arg<const_char_*,_true>(&local_58,&local_98,&local_60,0,(QChar)0x20);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_58);
    QList<QString>::end((QList<QString> *)&local_78);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_60 == (char *)0x0) {
      psVar9 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)0xffffffffffffffff;
      do {
        psVar9 = psVar7 + 1;
        pcVar1 = local_60 + 1 + (long)psVar7;
        psVar7 = psVar9;
      } while (*pcVar1 != '\0');
    }
    QVar11.m_data = psVar9;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar11);
    qVar6 = local_58.d.size;
    pcVar5 = local_58.d.ptr;
    pDVar3 = local_58.d.d;
    if (s == (char *)0x0) {
      psVar9 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)0xffffffffffffffff;
      do {
        psVar9 = psVar7 + 1;
        pcVar1 = s + 1 + (long)psVar7;
        psVar7 = psVar9;
      } while (*pcVar1 != '\0');
    }
    QVar12.m_data = psVar9;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    pDVar4 = local_58.d.d;
    pcVar8 = local_58.d.ptr;
    if (local_58.d.ptr == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    QtPrivate::QStringList_join((QList *)&local_58,(QChar *)&local_78,(longlong)pcVar8);
    __return_storage_ptr__->xo_type = tTagValue;
    (__return_storage_ptr__->xo_text).d.d = pDVar3;
    (__return_storage_ptr__->xo_text).d.ptr = pcVar5;
    (__return_storage_ptr__->xo_text).d.size = qVar6;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (__return_storage_ptr__->xo_value).d.d = local_58.d.d;
    (__return_storage_ptr__->xo_value).d.ptr = local_58.d.ptr;
    (__return_storage_ptr__->xo_value).d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_001f73ad:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline XmlOutput::xml_output attrTagX(const char *name, const QStringList &v, const char *s = ",")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(name));
    return tagValue(name, temp.join(s));
}